

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::InvalidTextureSizesAreRejectedValidAreAcceptedTest::iterate
          (InvalidTextureSizesAreRejectedValidAreAcceptedTest *this)

{
  bool bVar1;
  int iVar2;
  deBool dVar3;
  deUint32 dVar4;
  ContextInfo *this_00;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *pTVar7;
  GLenum error_code;
  Functions *gl;
  InvalidTextureSizesAreRejectedValidAreAcceptedTest *this_local;
  long lVar6;
  
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (this_00,"GL_OES_texture_storage_multisample_2d_array");
  this->gl_oes_texture_multisample_2d_array_supported = bVar1;
  if (this->gl_oes_texture_multisample_2d_array_supported == '\0') {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"OES_texture_storage_multisample_2d_array");
  }
  else {
    pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar5->_vptr_RenderContext[3])();
    lVar6 = CONCAT44(extraout_var,iVar2);
    initInternals(this);
    do {
      dVar3 = ::deGetFalse();
      if ((dVar3 != 0) || (this->to_id_2d_array_1 == 0)) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"First texture object has not been generated.","to_id_2d_array_1 != 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                   ,0xc3);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    do {
      dVar3 = ::deGetFalse();
      if ((dVar3 != 0) || (this->to_id_2d_array_2 == 0)) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Second texture object has not been generated.","to_id_2d_array_2 != 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                   ,0xc4);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    do {
      dVar3 = ::deGetFalse();
      if ((dVar3 != 0) || (this->to_id_2d_array_3 == 0)) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Third texture object has not been generated.","to_id_2d_array_3 != 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                   ,0xc5);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    do {
      dVar3 = ::deGetFalse();
      if ((dVar3 != 0) || (this->max_texture_size < 0x800)) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Invalid GL_MAX_TEXTURE_SIZE was returned.","max_texture_size >= 2048",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                   ,200);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    do {
      dVar3 = ::deGetFalse();
      if ((dVar3 != 0) || (this->max_array_texture_layers < 0x100)) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Invalid GL_MAX_ARRAY_TEXTURE_LAYERS was returned.",
                   "max_array_texture_layers >= 256",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                   ,0xc9);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    (**(code **)(lVar6 + 0xb8))(0x9102,this->to_id_2d_array_1);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,
                    "Unexpected error was generated when binding texture object to GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target."
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                    ,0xd2);
    (**(code **)(lVar6 + 0x13a8))(0x9102,2,0x8058,4,4,0,1);
    iVar2 = (**(code **)(lVar6 + 0x800))();
    do {
      dVar3 = ::deGetFalse();
      if ((dVar3 != 0) || (iVar2 != 0x501)) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"gltexStorage3DMultisample() did not generate GL_INVALID_VALUE error.",
                   "error_code == GL_INVALID_VALUE",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                   ,0xdd);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    (**(code **)(lVar6 + 0x13a8))(0x9102,2,0x8058,4,4,this->max_array_texture_layers + 1,1);
    iVar2 = (**(code **)(lVar6 + 0x800))();
    do {
      dVar3 = ::deGetFalse();
      if ((dVar3 != 0) || (iVar2 != 0x501)) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"gltexStorage3DMultisample() did not generate GL_INVALID_VALUE error.",
                   "error_code == GL_INVALID_VALUE",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                   ,0xe9);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    (**(code **)(lVar6 + 0x13a8))(0x9102,2,0x8058,4,4,1,1);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"gltexStorage3DMultisample() reported unexpected error code.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                    ,0xf1);
    (**(code **)(lVar6 + 0xb8))(0x9102,this->to_id_2d_array_2);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,
                    "Unexpected error was generated when binding texture object to GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target."
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                    ,0xfa);
    (**(code **)(lVar6 + 0x13a8))(0x9102,2,0x8058,4,4,this->max_array_texture_layers,1);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"gltexStorage3DMultisample() reported unexpected error code.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                    ,0x103);
    (**(code **)(lVar6 + 0xb8))(0x9102,this->to_id_2d_array_3);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,
                    "Unexpected error was generated when binding texture object to GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target."
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                    ,0x10c);
    (**(code **)(lVar6 + 0x13a8))
              (0x9102,2,0x8058,this->max_texture_size + 1,this->max_texture_size,2,1);
    iVar2 = (**(code **)(lVar6 + 0x800))();
    do {
      dVar3 = ::deGetFalse();
      if ((dVar3 != 0) || (iVar2 != 0x501)) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"gltexStorage3DMultisample() did not generate GL_INVALID_VALUE error.",
                   "error_code == GL_INVALID_VALUE",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                   ,0x118);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    (**(code **)(lVar6 + 0x13a8))
              (0x9102,2,0x8058,this->max_texture_size,this->max_texture_size + 1,2,1);
    iVar2 = (**(code **)(lVar6 + 0x800))();
    do {
      dVar3 = ::deGetFalse();
      if ((dVar3 != 0) || (iVar2 != 0x501)) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"gltexStorage3DMultisample() did not generate GL_INVALID_VALUE error.",
                   "error_code == GL_INVALID_VALUE",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                   ,0x124);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult InvalidTextureSizesAreRejectedValidAreAcceptedTest::iterate()
{
	gl_oes_texture_multisample_2d_array_supported =
		m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array");

	if (!gl_oes_texture_multisample_2d_array_supported)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "OES_texture_storage_multisample_2d_array");

		return STOP;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* Check if texture objects were generated properly. */
	TCU_CHECK_MSG(to_id_2d_array_1 != 0, "First texture object has not been generated.");
	TCU_CHECK_MSG(to_id_2d_array_2 != 0, "Second texture object has not been generated.");
	TCU_CHECK_MSG(to_id_2d_array_3 != 0, "Third texture object has not been generated.");

	/* Make sure valid maximum 3d image dimensions were returned. */
	TCU_CHECK_MSG(max_texture_size >= 2048, "Invalid GL_MAX_TEXTURE_SIZE was returned.");
	TCU_CHECK_MSG(max_array_texture_layers >= 256, "Invalid GL_MAX_ARRAY_TEXTURE_LAYERS was returned.");

	/* Bind texture object to_id_2d_array_1 to GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target. */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, to_id_2d_array_1);

	/* Make sure no error was generated. */
	glw::GLenum error_code = gl.getError();

	GLU_EXPECT_NO_ERROR(error_code, "Unexpected error was generated when binding texture object to "
									"GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target.");

	/* Call gltexStorage3DMultisample() with invalid depth argument value (depth value cannot be negative). */
	gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 2, GL_RGBA8, 4, 4,
							   0, /* Invalid depth argument value. */
							   GL_TRUE);

	/* Expect GL_INVALID_VALUE error code. */
	error_code = gl.getError();

	TCU_CHECK_MSG(error_code == GL_INVALID_VALUE,
				  "gltexStorage3DMultisample() did not generate GL_INVALID_VALUE error.");

	/* Call gltexStorage3DMultisample() with invalid depth argument value
	 * (depth value cannot be greater than GL_MAX_TEXTURE_SIZE). */
	gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 2, GL_RGBA8, 4, 4,
							   max_array_texture_layers + 1, /* Invalid depth argument value. */
							   GL_TRUE);

	/* Expect GL_INVALID_VALUE error code. */
	error_code = gl.getError();

	TCU_CHECK_MSG(error_code == GL_INVALID_VALUE,
				  "gltexStorage3DMultisample() did not generate GL_INVALID_VALUE error.");

	/* Set up a valid immutable 2D array multisample texture object using gltexStorage3DMultisample() call. */
	gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 2, GL_RGBA8, 4, 4, 1, GL_TRUE);

	/* Make sure no error was generated. */
	error_code = gl.getError();

	GLU_EXPECT_NO_ERROR(error_code, "gltexStorage3DMultisample() reported unexpected error code.");

	/* Bind texture object to_id_2d_array_2 to GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target. */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, to_id_2d_array_2);

	/* Make sure no error was generated. */
	error_code = gl.getError();

	GLU_EXPECT_NO_ERROR(error_code, "Unexpected error was generated when binding texture object to "
									"GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target.");

	/* Set up a valid immutable 2D array multisample texture object using gltexStorage3DMultisample() call. */
	gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 2, GL_RGBA8, 4, 4, max_array_texture_layers,
							   GL_TRUE);

	/* Make sure no error was generated. */
	error_code = gl.getError();

	GLU_EXPECT_NO_ERROR(error_code, "gltexStorage3DMultisample() reported unexpected error code.");

	/* Bind texture object to_id_2d_array_3 to GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target. */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, to_id_2d_array_3);

	/* Make sure no error was generated. */
	error_code = gl.getError();

	GLU_EXPECT_NO_ERROR(error_code, "Unexpected error was generated when binding texture object to "
									"GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target.");

	/* Call gltexStorage3DMultisample() with invalid width argument value
	 * (width value cannot be greater than GL_MAX_3D_TEXTURE_SIZE). */
	gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 2, GL_RGBA8,
							   max_texture_size + 1, /* Invalid width argument value. */
							   max_texture_size, 2, GL_TRUE);

	/* Expect GL_INVALID_VALUE error code. */
	error_code = gl.getError();

	TCU_CHECK_MSG(error_code == GL_INVALID_VALUE,
				  "gltexStorage3DMultisample() did not generate GL_INVALID_VALUE error.");

	/* Call gltexStorage3DMultisample() with invalid height argument value
	 * (height value cannot be greater than GL_MAX_3D_TEXTURE_SIZE). */
	gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 2, GL_RGBA8, max_texture_size,
							   max_texture_size + 1, /* Invalid height argument value. */
							   2, GL_TRUE);

	/* Expect GL_INVALID_VALUE error code. */
	error_code = gl.getError();

	TCU_CHECK_MSG(error_code == GL_INVALID_VALUE,
				  "gltexStorage3DMultisample() did not generate GL_INVALID_VALUE error.");

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}